

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

int Cbs_VarFanin0Value(Gia_Obj_t *pVar)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  undefined4 local_14;
  Gia_Obj_t *pVar_local;
  
  pGVar3 = Gia_ObjFanin0(pVar);
  iVar1 = Cbs_VarIsAssigned(pGVar3);
  if (iVar1 == 0) {
    local_14 = 2;
  }
  else {
    pGVar3 = Gia_ObjFanin0(pVar);
    local_14 = Cbs_VarValue(pGVar3);
    uVar2 = Gia_ObjFaninC0(pVar);
    local_14 = local_14 ^ uVar2;
  }
  return local_14;
}

Assistant:

static inline int   Cbs_VarFanin0Value( Gia_Obj_t * pVar )     { return !Cbs_VarIsAssigned(Gia_ObjFanin0(pVar)) ? 2 : (Cbs_VarValue(Gia_ObjFanin0(pVar)) ^ Gia_ObjFaninC0(pVar)); }